

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteToConsoleListener.cpp
# Opt level: O3

void __thiscall
Common::WriteToConsoleListener::~WriteToConsoleListener(WriteToConsoleListener *this)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 == 0) {
    pcVar4 = *(char **)((this->super_Listener)._vptr_Listener[-1] + 8);
    pcVar4 = pcVar4 + (*pcVar4 == '*');
    sVar2 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"::",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"~WriteToConsoleListener",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  __clang_call_terminate(uVar3);
}

Assistant:

WriteToConsoleListener::~WriteToConsoleListener()
{
    auto lock = std::lock_guard(_mutex);
    std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
}